

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O2

StringValueEventLogEntry * __thiscall
TTD::EventLog::
ReplayGetReplayEvent_Helper<TTD::NSLogEvents::StringValueEventLogEntry,(TTD::NSLogEvents::EventKind)6>
          (EventLog *this)

{
  Iterator *this_00;
  bool bVar1;
  EventLogEntry *pEVar2;
  StringValueEventLogEntry *pSVar3;
  EventLog *this_01;
  
  this_00 = &this->m_currentReplayEventIterator;
  this_01 = (EventLog *)this_00;
  bVar1 = TTEventList::Iterator::IsValid(this_00);
  if (!bVar1) {
    AbortReplayReturnToHost(this_01);
  }
  pEVar2 = TTEventList::Iterator::Current(this_00);
  if (pEVar2->EventTimeStamp == this->m_eventTimeCtr) {
    pEVar2 = TTEventList::Iterator::Current(this_00);
    AdvanceTimeAndPositionForReplay(this);
    pSVar3 = NSLogEvents::
             GetInlineEventDataAs<TTD::NSLogEvents::StringValueEventLogEntry,(TTD::NSLogEvents::EventKind)6>
                       (pEVar2);
    return pSVar3;
  }
  TTDAbort_unrecoverable_error("Out of Sync!!!");
}

Assistant:

const T* ReplayGetReplayEvent_Helper()
        {
            if(!this->m_currentReplayEventIterator.IsValid())
            {
                this->AbortReplayReturnToHost();
            }

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            TTDAssert(this->m_currentReplayEventIterator.Current()->EventTimeStamp == this->m_eventTimeCtr, "Out of Sync!!!");
#endif

            const NSLogEvents::EventLogEntry* evt = this->m_currentReplayEventIterator.Current();

            this->AdvanceTimeAndPositionForReplay();

            return NSLogEvents::GetInlineEventDataAs<T, tag>(evt);
        }